

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_zero_block(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  bool bVar3;
  code *pcVar4;
  int iVar5;
  uint uVar6;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint32_t *__s;
  uint uVar12;
  uint uVar13;
  ulong uVar7;
  
  piVar1 = strm->state;
  iVar5 = piVar1->bitp;
  if (iVar5 < 1) {
    sVar8 = strm->avail_in;
    iVar9 = iVar5;
    do {
      sVar8 = sVar8 - 1;
      if (sVar8 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar8;
      uVar11 = piVar1->acc << 8;
      piVar1->acc = uVar11;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      uVar11 = *pbVar2 | uVar11;
      piVar1->acc = uVar11;
      iVar5 = iVar9 + 8;
      piVar1->bitp = iVar5;
      bVar3 = iVar9 < -7;
      iVar9 = iVar5;
    } while (bVar3);
  }
  else {
    uVar11 = piVar1->acc;
  }
  uVar6 = iVar5 - 1;
  if ((uVar11 >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
    do {
      iVar9 = iVar5;
      if (iVar5 == 1) {
        if (strm->avail_in == 0) {
          return 0;
        }
        strm->avail_in = strm->avail_in - 1;
        piVar1->acc = uVar11 << 8;
        pbVar2 = strm->next_in;
        strm->next_in = pbVar2 + 1;
        uVar11 = uVar11 << 8 | (ulong)*pbVar2;
        piVar1->acc = uVar11;
        iVar9 = 9;
      }
      uVar10 = piVar1->fs + 1;
      piVar1->fs = uVar10;
      iVar5 = iVar9 + -1;
      piVar1->bitp = iVar5;
    } while ((uVar11 >> ((ulong)(iVar9 - 2U & 0xff) & 0x3f) & 1) == 0);
    uVar6 = iVar9 - 2;
  }
  else {
    uVar10 = piVar1->fs;
  }
  uVar12 = uVar10 + 1;
  piVar1->fs = 0;
  piVar1->bitp = uVar6;
  if (uVar12 == 5) {
    __s = piVar1->rsip;
    uVar11 = (long)__s - (long)piVar1->rsi_buffer;
    uVar6 = strm->block_size;
    uVar12 = (uint)((uVar11 >> 2 & 0xffffffff) / (ulong)uVar6);
    uVar13 = strm->rsi - uVar12;
    uVar10 = uVar12 + 0x3f;
    if (-1 < (int)uVar12) {
      uVar10 = uVar12;
    }
    uVar12 = ((uVar10 & 0xffffffc0) - uVar12) + 0x40;
    if ((int)uVar13 < (int)uVar12) {
      uVar12 = uVar13;
    }
  }
  else {
    if (5 < uVar12) {
      uVar12 = uVar10;
    }
    uVar6 = strm->block_size;
    __s = piVar1->rsip;
    uVar11 = (long)__s - (long)piVar1->rsi_buffer;
  }
  uVar6 = uVar6 * uVar12 - piVar1->ref;
  uVar7 = (ulong)uVar6;
  iVar5 = -1;
  if (uVar7 <= piVar1->rsi_size - ((long)uVar11 >> 2)) {
    uVar11 = (ulong)(piVar1->bytes_per_sample * uVar6);
    if (strm->avail_out < uVar11) {
      piVar1->sample_counter = uVar6;
      pcVar4 = m_zero_output;
    }
    else {
      memset(__s,0,uVar7 * 4);
      piVar1->rsip = piVar1->rsip + uVar7;
      strm->avail_out = strm->avail_out - uVar11;
      pcVar4 = m_next_cds;
    }
    piVar1->mode = pcVar4;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int m_zero_block(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    uint32_t zero_blocks;
    uint32_t zero_samples;
    uint32_t zero_bytes;

    if (fs_ask(strm) == 0)
        return M_EXIT;

    zero_blocks = state->fs + 1;
    fs_drop(strm);

    if (zero_blocks == ROS) {
        int b = (int)RSI_USED_SIZE(state) / strm->block_size;
        zero_blocks = MIN((int)(strm->rsi - b), 64 - (b % 64));
    } else if (zero_blocks > ROS) {
        zero_blocks--;
    }

    zero_samples = zero_blocks * strm->block_size - state->ref;
    if (state->rsi_size - RSI_USED_SIZE(state) < zero_samples)
        return M_ERROR;

    zero_bytes = zero_samples * state->bytes_per_sample;
    if (strm->avail_out >= zero_bytes) {
        memset(state->rsip, 0, zero_samples * sizeof(uint32_t));
        state->rsip += zero_samples;
        strm->avail_out -= zero_bytes;
        state->mode = m_next_cds;
    } else {
        state->sample_counter = zero_samples;
        state->mode = m_zero_output;
    }
    return M_CONTINUE;
}